

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bamtools_split.cpp
# Opt level: O0

void __thiscall
BamTools::SplitTool::SplitToolPrivate::CloseWriters<bool>
          (SplitToolPrivate *this,
          map<bool,_BamTools::BamWriter_*,_std::less<bool>,_std::allocator<std::pair<const_bool,_BamTools::BamWriter_*>_>_>
          *writers)

{
  bool bVar1;
  reference ppVar2;
  BamWriter *writer;
  WriterMapIterator writerEnd;
  WriterMapIterator writerIter;
  map<bool,_BamTools::BamWriter_*,_std::less<bool>,_std::allocator<std::pair<const_bool,_BamTools::BamWriter_*>_>_>
  *in_stack_ffffffffffffffc8;
  _Rb_tree_iterator<std::pair<const_bool,_BamTools::BamWriter_*>_> *in_stack_ffffffffffffffd0;
  _Rb_tree_iterator<std::pair<const_bool,_BamTools::BamWriter_*>_> *this_00;
  _Self local_20;
  _Self local_18 [3];
  
  local_18[0]._M_node =
       (_Base_ptr)
       std::
       map<bool,_BamTools::BamWriter_*,_std::less<bool>,_std::allocator<std::pair<const_bool,_BamTools::BamWriter_*>_>_>
       ::begin(in_stack_ffffffffffffffc8);
  local_20._M_node =
       (_Base_ptr)
       std::
       map<bool,_BamTools::BamWriter_*,_std::less<bool>,_std::allocator<std::pair<const_bool,_BamTools::BamWriter_*>_>_>
       ::end(in_stack_ffffffffffffffc8);
  while (bVar1 = std::operator!=(local_18,&local_20), bVar1) {
    ppVar2 = std::_Rb_tree_iterator<std::pair<const_bool,_BamTools::BamWriter_*>_>::operator*
                       ((_Rb_tree_iterator<std::pair<const_bool,_BamTools::BamWriter_*>_> *)0x240deb
                       );
    this_00 = (_Rb_tree_iterator<std::pair<const_bool,_BamTools::BamWriter_*>_> *)ppVar2->second;
    if ((this_00 != (_Rb_tree_iterator<std::pair<const_bool,_BamTools::BamWriter_*>_> *)0x0) &&
       (BamWriter::Close((BamWriter *)0x240e08), in_stack_ffffffffffffffd0 = this_00,
       this_00 != (_Rb_tree_iterator<std::pair<const_bool,_BamTools::BamWriter_*>_> *)0x0)) {
      BamWriter::~BamWriter((BamWriter *)this_00);
      operator_delete(this_00);
      in_stack_ffffffffffffffd0 = this_00;
    }
    std::_Rb_tree_iterator<std::pair<const_bool,_BamTools::BamWriter_*>_>::operator++
              (in_stack_ffffffffffffffd0);
  }
  std::
  map<bool,_BamTools::BamWriter_*,_std::less<bool>,_std::allocator<std::pair<const_bool,_BamTools::BamWriter_*>_>_>
  ::clear((map<bool,_BamTools::BamWriter_*,_std::less<bool>,_std::allocator<std::pair<const_bool,_BamTools::BamWriter_*>_>_>
           *)0x240e4b);
  return;
}

Assistant:

void SplitTool::SplitToolPrivate::CloseWriters(std::map<T, BamWriter*>& writers)
{

    typedef std::map<T, BamWriter*> WriterMap;
    typedef typename WriterMap::iterator WriterMapIterator;

    // iterate over writers
    WriterMapIterator writerIter = writers.begin();
    WriterMapIterator writerEnd = writers.end();
    for (; writerIter != writerEnd; ++writerIter) {
        BamWriter* writer = (*writerIter).second;
        if (writer == 0) continue;

        // close BamWriter
        writer->Close();

        // destroy BamWriter
        delete writer;
        writer = 0;
    }

    // clear the container (destroying the items doesn't remove them)
    writers.clear();
}